

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Output.c
# Opt level: O0

WJTL_STATUS
CreateJsonAndVerifyEx(JlDataObject *ObjectRoot,JL_OUTPUT_FLAGS OutputFlags,char *StringMatch)

{
  JL_STATUS JVar1;
  int iVar2;
  _Bool _result_1;
  char *pcStack_30;
  _Bool _result;
  char *jsonString;
  char *pcStack_20;
  WJTL_STATUS TestReturn;
  char *StringMatch_local;
  JL_OUTPUT_FLAGS OutputFlags_local;
  JlDataObject *ObjectRoot_local;
  
  jsonString._4_4_ = WJTL_STATUS_SUCCESS;
  pcStack_30 = (char *)0x0;
  pcStack_20 = StringMatch;
  StringMatch_local = (char *)OutputFlags;
  OutputFlags_local = (JL_OUTPUT_FLAGS)ObjectRoot;
  JVar1 = JlOutputJsonEx(ObjectRoot,OutputFlags,&stack0xffffffffffffffd0);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlOutputJsonEx( ObjectRoot, OutputFlags, &jsonString ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"CreateJsonAndVerifyEx",0x154);
  if (JVar1 != JL_STATUS_SUCCESS) {
    jsonString._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar2 = strcmp(pcStack_30,pcStack_20);
  WjTestLib_Assert(iVar2 == 0,"strcmp( jsonString, StringMatch ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"CreateJsonAndVerifyEx",0x155);
  if (iVar2 != 0) {
    jsonString._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Free(pcStack_30);
  return jsonString._4_4_;
}

Assistant:

static
WJTL_STATUS
    CreateJsonAndVerifyEx
    (
        JlDataObject const* ObjectRoot,
        JL_OUTPUT_FLAGS     OutputFlags,
        char const*         StringMatch
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    char* jsonString = NULL;

    JL_ASSERT_SUCCESS( JlOutputJsonEx( ObjectRoot, OutputFlags, &jsonString ) );
    JL_ASSERT( strcmp( jsonString, StringMatch ) == 0 );
    JlFree( jsonString );
    jsonString = NULL;
    return TestReturn;
}